

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O3

DictionaryValue *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::MILSpec::DictionaryValue>
          (Arena *arena)

{
  DictionaryValue *this;
  
  if (arena == (Arena *)0x0) {
    this = (DictionaryValue *)operator_new(0x30);
    CoreML::Specification::MILSpec::DictionaryValue::DictionaryValue(this,(Arena *)0x0,false);
  }
  else {
    this = (DictionaryValue *)
           AllocateAlignedWithHook
                     (arena,0x30,
                      (type_info *)&CoreML::Specification::MILSpec::DictionaryValue::typeinfo);
    CoreML::Specification::MILSpec::DictionaryValue::DictionaryValue(this,arena,false);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }